

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O1

void __thiscall FirewirePort::PollEvents(FirewirePort *this)

{
  int iVar1;
  int iVar2;
  timeval timeout;
  fd_set fds;
  timeval local_a8;
  fd_set local_98;
  
  local_a8.tv_sec = 0;
  local_a8.tv_usec = 0;
  iVar1 = raw1394_get_fd(this->handle);
  local_98.fds_bits[0] = 0;
  local_98.fds_bits[1] = 0;
  local_98.fds_bits[2] = 0;
  local_98.fds_bits[3] = 0;
  local_98.fds_bits[4] = 0;
  local_98.fds_bits[5] = 0;
  local_98.fds_bits[6] = 0;
  local_98.fds_bits[7] = 0;
  local_98.fds_bits[8] = 0;
  local_98.fds_bits[9] = 0;
  local_98.fds_bits[10] = 0;
  local_98.fds_bits[0xb] = 0;
  local_98.fds_bits[0xc] = 0;
  local_98.fds_bits[0xd] = 0;
  iVar2 = iVar1 + 0x3f;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  local_98.fds_bits[0xe] = 0;
  local_98.fds_bits[0xf] = 0;
  local_98.fds_bits[iVar2 >> 6] = local_98.fds_bits[iVar2 >> 6] | 1L << ((byte)iVar1 & 0x3f);
  iVar2 = select(iVar1 + 1,&local_98,(fd_set *)0x0,(fd_set *)0x0,&local_a8);
  if (0 < iVar2) {
    raw1394_loop_iterate(this->handle);
  }
  return;
}

Assistant:

void FirewirePort::PollEvents(void)
{
    fd_set fds;
    struct timeval timeout = {0, 0};

    int fd = raw1394_get_fd(handle);
    FD_ZERO(&fds);
    FD_SET(fd, &fds);
    int ret = select(fd+1, &fds, 0, 0, &timeout);
    if (ret > 0)
        raw1394_loop_iterate(handle);
}